

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool operator==(BigNum *a,BigNum *b)

{
  bool bVar1;
  BigNum local_90;
  BigNum local_70;
  BigNum local_50;
  BigNum local_30;
  
  BigNum::BigNum(&local_30,a);
  BigNum::BigNum(&local_50,b);
  bVar1 = operator>(&local_30,&local_50);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    BigNum::BigNum(&local_70,a);
    BigNum::BigNum(&local_90,b);
    bVar1 = operator<(&local_70,&local_90);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
    bVar1 = !bVar1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_30);
  return bVar1;
}

Assistant:

bool operator ==(BigNum a, BigNum b){
    return !(a > b || a < b);
}